

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int bsdunzip_getopt(bsdunzip *bsdunzip)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint local_4c;
  int required;
  int opt;
  size_t optlength;
  char *long_prefix;
  char *p;
  bsdunzip_option *match2;
  bsdunzip_option *match;
  bsdunzip_option *popt;
  bsdunzip *bsdunzip_local;
  
  while( true ) {
    match2 = (bsdunzip_option *)0x0;
    p = (char *)0x0;
    local_4c = 0;
    bsdunzip->argument = (char *)0x0;
    if (bsdunzip->getopt_state == 0) {
      bsdunzip->argv = bsdunzip->argv + 1;
      bsdunzip->argc = bsdunzip->argc + -1;
      if (*bsdunzip->argv == (char *)0x0) {
        return -1;
      }
      bsdunzip->getopt_state = 1;
    }
    if (bsdunzip->getopt_state == 1) {
      if (*bsdunzip->argv == (char *)0x0) {
        return -1;
      }
      if (**bsdunzip->argv != '-') {
        return -1;
      }
      iVar2 = strcmp(*bsdunzip->argv,"--");
      if (iVar2 == 0) {
        bsdunzip->argv = bsdunzip->argv + 1;
        bsdunzip->argc = bsdunzip->argc + -1;
        bsdunzip_optind = bsdunzip_optind + 1;
        return -1;
      }
      ppcVar1 = bsdunzip->argv;
      bsdunzip->argv = ppcVar1 + 1;
      bsdunzip->getopt_word = *ppcVar1;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
      if (bsdunzip->getopt_word[1] == '-') {
        bsdunzip->getopt_state = 3;
        bsdunzip->getopt_word = bsdunzip->getopt_word + 2;
      }
      else {
        bsdunzip->getopt_state = 2;
        bsdunzip->getopt_word = bsdunzip->getopt_word + 1;
      }
    }
    if (bsdunzip->getopt_state != 2) goto LAB_0010605e;
    pcVar3 = bsdunzip->getopt_word;
    bsdunzip->getopt_word = pcVar3 + 1;
    local_4c = (uint)*pcVar3;
    if (local_4c != 0) break;
    bsdunzip->getopt_state = 1;
  }
  pcVar3 = strchr(short_options,local_4c);
  if (pcVar3 == (char *)0x0) {
    bsdunzip_local._4_4_ = 0x3f;
  }
  else {
    if (pcVar3[1] == ':') {
      if (*bsdunzip->getopt_word == '\0') {
        bsdunzip->getopt_word = *bsdunzip->argv;
        if (bsdunzip->getopt_word == (char *)0x0) {
          lafe_warnc(0,"Option -%c requires an argument",(ulong)local_4c);
          return 0x3f;
        }
        bsdunzip->argv = bsdunzip->argv + 1;
        bsdunzip->argc = bsdunzip->argc + -1;
        bsdunzip_optind = bsdunzip_optind + 1;
      }
      bsdunzip->getopt_state = 1;
      bsdunzip->argument = bsdunzip->getopt_word;
    }
LAB_0010605e:
    if (bsdunzip->getopt_state == 3) {
      bsdunzip->getopt_state = 1;
      pcVar3 = strchr(bsdunzip->getopt_word,0x3d);
      if (pcVar3 == (char *)0x0) {
        _required = strlen(bsdunzip->getopt_word);
      }
      else {
        _required = (long)pcVar3 - (long)bsdunzip->getopt_word;
        bsdunzip->argument = pcVar3 + 1;
      }
      for (match = bsdunzip_longopts; match->name != (char *)0x0; match = match + 1) {
        if ((*match->name == *bsdunzip->getopt_word) &&
           (iVar2 = strncmp(bsdunzip->getopt_word,match->name,_required), iVar2 == 0)) {
          p = (char *)match2;
          match2 = match;
          sVar4 = strlen(match->name);
          if (sVar4 == _required) {
            p = (char *)0x0;
            break;
          }
        }
      }
      if (match2 == (bsdunzip_option *)0x0) {
        lafe_warnc(0,"Option %s%s is not supported","--",bsdunzip->getopt_word);
        bsdunzip_local._4_4_ = 0x3f;
      }
      else if (p == (char *)0x0) {
        if (match2->required == 0) {
          if (bsdunzip->argument != (char *)0x0) {
            lafe_warnc(0,"Option %s%s does not allow an argument","--",match2->name);
            return 0x3f;
          }
        }
        else if (bsdunzip->argument == (char *)0x0) {
          bsdunzip->argument = *bsdunzip->argv;
          if (bsdunzip->argument == (char *)0x0) {
            lafe_warnc(0,"Option %s%s requires an argument","--",match2->name);
            return 0x3f;
          }
          bsdunzip->argv = bsdunzip->argv + 1;
          bsdunzip->argc = bsdunzip->argc + -1;
          bsdunzip_optind = bsdunzip_optind + 1;
        }
        bsdunzip_local._4_4_ = match2->equivalent;
      }
      else {
        lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)","--",bsdunzip->getopt_word,
                   match2->name,*(undefined8 *)p);
        bsdunzip_local._4_4_ = 0x3f;
      }
    }
    else {
      bsdunzip_local._4_4_ = local_4c;
    }
  }
  return bsdunzip_local._4_4_;
}

Assistant:

int
bsdunzip_getopt(struct bsdunzip *bsdunzip)
{
	enum { state_start = 0, state_next_word, state_short, state_long };

	const struct bsdunzip_option *popt, *match, *match2;
	const char *p, *long_prefix;
	size_t optlength;
	int opt;
	int required;

again:
	match = NULL;
	match2 = NULL;
	long_prefix = "--";
	opt = OPTION_NONE;
	required = 0;
	bsdunzip->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdunzip->getopt_state == state_start) {
		/* Skip program name. */
		++bsdunzip->argv;
		--bsdunzip->argc;
		if (*bsdunzip->argv == NULL)
			return (-1);
		bsdunzip->getopt_state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdunzip->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdunzip->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdunzip->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdunzip->argv[0], "--") == 0) {
			++bsdunzip->argv;
			--bsdunzip->argc;
			bsdunzip_optind++;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdunzip->getopt_word = *bsdunzip->argv++;
		--bsdunzip->argc;
		bsdunzip_optind++;
		if (bsdunzip->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdunzip->getopt_state = state_long;
			bsdunzip->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdunzip->getopt_state = state_short;
			++bsdunzip->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdunzip->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdunzip->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdunzip->getopt_state = state_next_word;
			goto again;
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdunzip->getopt_word already points to it. */
			if (bsdunzip->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdunzip->getopt_word = *bsdunzip->argv;
				if (bsdunzip->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
			bsdunzip->getopt_state = state_next_word;
			bsdunzip->argument = bsdunzip->getopt_word;
		}
	}

	/* We're reading a long option */
	if (bsdunzip->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdunzip->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdunzip->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdunzip->getopt_word);
			bsdunzip->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdunzip->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = bsdunzip_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdunzip->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdunzip->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdunzip->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdunzip->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdunzip->argument == NULL) {
				bsdunzip->argument = *bsdunzip->argv;
				if (bsdunzip->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdunzip->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}